

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int coda_ascbin_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  int64_t *piVar1;
  coda_expression *expr;
  int64_t iVar2;
  int iVar3;
  ulong uVar4;
  coda_dynamic_type *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  coda_type *pcVar9;
  int64_t iVar10;
  long in_FS_OFFSET;
  int64_t field_bit_size;
  int available;
  int64_t rel_bit_offset;
  coda_cursor field_cursor;
  int64_t local_360;
  int local_354;
  long local_350;
  anon_struct_24_3_5e6533e2 *local_348;
  coda_cursor local_340;
  
  pcVar9 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar9->format) {
    pcVar9 = *(coda_type **)&pcVar9->type_class;
  }
  lVar8 = pcVar9->bit_size;
  if (lVar8 < 0) {
    if (pcVar9->type_class == 1) {
      iVar3 = coda_cursor_get_num_elements(cursor,&local_350);
      lVar8 = local_350;
      if (iVar3 == 0) {
        if (local_350 == 0) {
          *bit_size = 0;
        }
        else {
          if (-1 < (*(coda_type **)(pcVar9 + 1))->bit_size) {
            lVar8 = (*(coda_type **)(pcVar9 + 1))->bit_size * local_350;
            goto LAB_00183782;
          }
          memcpy(&local_340,cursor,0x310);
          lVar7 = (long)local_340.n;
          uVar4 = (ulong)(local_340.n + 1U);
          local_340.n = local_340.n + 1U;
          local_340.stack[lVar7].bit_offset = local_340.stack[lVar7 + -1].bit_offset;
          if (lVar8 < 1) {
            iVar10 = 0;
          }
          else {
            lVar8 = 0;
            iVar10 = 0;
            do {
              iVar3 = (int)uVar4 + -1;
              local_340.stack[iVar3].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar9 + 1);
              local_340.stack[iVar3].index = lVar8;
              iVar3 = coda_cursor_get_bit_size(&local_340,&local_360);
              if (iVar3 != 0) goto LAB_00183892;
              uVar4 = (ulong)local_340.n;
              piVar1 = &local_340.stack[uVar4 - 1].bit_offset;
              *piVar1 = *piVar1 + local_360;
              iVar10 = iVar10 + local_360;
              lVar8 = lVar8 + 1;
            } while (lVar8 < local_350);
          }
          *bit_size = iVar10;
        }
        goto LAB_00183785;
      }
    }
    else {
      if (pcVar9->type_class != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,0x300,"int coda_ascbin_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      if ((*(int *)(in_FS_OFFSET + -0x1200) == 0) || (pcVar9->size_expr == (coda_expression *)0x0))
      {
        if (pcVar9[1].attributes == (coda_type_record *)0x0) {
          if ((long)pcVar9[1].name < 1) {
LAB_00183a94:
            iVar10 = 0;
          }
          else {
            memcpy(&local_340,cursor,0x310);
            iVar3 = coda_cursor_goto_first_record_field(&local_340);
            if (iVar3 != 0) goto LAB_00183892;
            pcVar6 = pcVar9[1].name;
            if ((long)pcVar6 < 1) goto LAB_00183a94;
            local_348 = cursor->stack;
            lVar8 = 0;
            iVar10 = 0;
            do {
              local_360 = -1;
              if (lVar8 < (long)(pcVar6 + -1)) {
                iVar3 = get_next_relative_field_bit_offset(&local_340,&local_350,&local_360);
                if (iVar3 != 0) goto LAB_00183892;
                if (local_360 < 0) goto LAB_001839d0;
              }
              else {
LAB_001839d0:
                iVar3 = coda_cursor_get_bit_size(&local_340,&local_360);
                if (iVar3 != 0) goto LAB_00183892;
              }
              iVar2 = local_360;
              pcVar6 = pcVar9[1].name;
              if (lVar8 < (long)(pcVar6 + -1)) {
                local_354 = 1;
                expr = *(coda_expression **)
                        (*(long *)(pcVar9[1].description + lVar8 * 8 + 8) + 0x20);
                if (expr == (coda_expression *)0x0) {
LAB_00183a2f:
                  pcVar5 = *(coda_dynamic_type **)
                            (*(long *)(pcVar9[1].description + lVar8 * 8 + 8) + 0x10);
                }
                else {
                  iVar3 = coda_expression_eval_bool(expr,cursor,&local_354);
                  if (iVar3 != 0) goto LAB_00183892;
                  if (local_354 != 0) goto LAB_00183a2f;
                  pcVar5 = coda_no_data_singleton(pcVar9->format);
                }
                lVar7 = (long)local_340.n;
                local_340.stack[lVar7 + -1].type = pcVar5;
                local_340.stack[lVar7 + -1].index = lVar8 + 1;
                local_340.stack[lVar7 + -1].bit_offset =
                     local_350 + local_348[(long)cursor->n + -1].bit_offset;
                pcVar6 = pcVar9[1].name;
              }
              lVar8 = lVar8 + 1;
              iVar10 = iVar10 + iVar2;
            } while (lVar8 < (long)pcVar6);
          }
          *bit_size = iVar10;
          goto LAB_00183785;
        }
        memcpy(&local_340,cursor,0x310);
        iVar3 = coda_cursor_goto_available_union_field(&local_340);
        if (iVar3 == 0) {
          iVar3 = coda_cursor_get_bit_size(&local_340,bit_size);
          if (iVar3 != 0) {
            return -1;
          }
          goto LAB_00183785;
        }
      }
      else {
        iVar3 = coda_expression_eval_integer(pcVar9->size_expr,cursor,bit_size);
        if (iVar3 == 0) {
          lVar8 = *bit_size;
          if (pcVar9->bit_size == -8) {
            lVar8 = lVar8 << 3;
            *bit_size = lVar8;
          }
          if (-1 < lVar8) goto LAB_00183785;
          coda_set_error(-300,"calculated size is negative (%ld bits)");
        }
        else {
          coda_add_error_message(" for size expression");
        }
        coda_cursor_add_to_error_message(cursor);
      }
    }
LAB_00183892:
    iVar3 = -1;
  }
  else {
LAB_00183782:
    *bit_size = lVar8;
LAB_00183785:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int coda_ascbin_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
    }
    else
    {
        switch (type->type_class)
        {
            case coda_record_class:
                {
                    coda_type_record *record = (coda_type_record *)type;

                    if (coda_option_use_fast_size_expressions && record->size_expr != NULL)
                    {
                        if (coda_expression_eval_integer(record->size_expr, cursor, bit_size) != 0)
                        {
                            coda_add_error_message(" for size expression");
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                        if (record->bit_size == -8)
                        {
                            /* convert 'byte size' to 'bit size' */
                            *bit_size *= 8;
                        }
                        if (*bit_size < 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)",
                                           (long)*bit_size);
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                    }
                    else if (record->union_field_expr != NULL)
                    {
                        coda_cursor field_cursor;

                        field_cursor = *cursor;
                        if (coda_cursor_goto_available_union_field(&field_cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(&field_cursor, bit_size) != 0)
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        int64_t record_bit_size;

                        record_bit_size = 0;
                        if (record->num_fields > 0)
                        {
                            coda_cursor field_cursor;
                            long i;

                            field_cursor = *cursor;
                            if (coda_cursor_goto_first_record_field(&field_cursor) != 0)
                            {
                                return -1;
                            }
                            for (i = 0; i < record->num_fields; i++)
                            {
                                int64_t rel_bit_offset;
                                int64_t field_bit_size;

                                field_bit_size = -1;
                                if (i < record->num_fields - 1)
                                {
                                    if (get_next_relative_field_bit_offset(&field_cursor, &rel_bit_offset,
                                                                           &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                if (field_bit_size < 0)
                                {
                                    if (coda_cursor_get_bit_size(&field_cursor, &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                record_bit_size += field_bit_size;
                                if (i < record->num_fields - 1)
                                {
                                    int available = 1;

                                    if (record->field[i + 1]->available_expr != NULL)
                                    {
                                        if (coda_expression_eval_bool(record->field[i + 1]->available_expr, cursor,
                                                                      &available) != 0)
                                        {
                                            return -1;
                                        }
                                    }
                                    if (available)
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            (coda_dynamic_type *)record->field[i + 1]->type;
                                    }
                                    else
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            coda_no_data_singleton(record->format);
                                    }
                                    field_cursor.stack[field_cursor.n - 1].index = i + 1;
                                    field_cursor.stack[field_cursor.n - 1].bit_offset =
                                        cursor->stack[cursor->n - 1].bit_offset + rel_bit_offset;
                                }
                            }
                        }
                        *bit_size = record_bit_size;
                    }
                }
                break;
            case coda_array_class:
                {
                    coda_type_array *array = (coda_type_array *)type;
                    long num_elements;

                    /* get the number of elements in array */
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }

                    if (num_elements == 0)
                    {
                        /* empty array */
                        *bit_size = 0;
                    }
                    else if (array->base_type->bit_size >= 0)
                    {
                        /* the basetype has a constant size. */
                        *bit_size = num_elements * array->base_type->bit_size;
                    }
                    else
                    {
                        coda_cursor array_cursor;
                        int64_t array_bit_size;
                        long i;

                        /* sum the sizes of the elements 'manually' */
                        array_bit_size = 0;
                        array_cursor = *cursor;
                        array_cursor.n++;
                        array_cursor.stack[array_cursor.n - 1].bit_offset =
                            array_cursor.stack[array_cursor.n - 2].bit_offset;
                        for (i = 0; i < num_elements; i++)
                        {
                            int64_t element_bit_size;

                            array_cursor.stack[array_cursor.n - 1].type = (coda_dynamic_type *)array->base_type;
                            array_cursor.stack[array_cursor.n - 1].index = i;
                            if (coda_cursor_get_bit_size(&array_cursor, &element_bit_size) != 0)
                            {
                                return -1;
                            }
                            array_bit_size += element_bit_size;
                            array_cursor.stack[array_cursor.n - 1].bit_offset += element_bit_size;
                        }
                        *bit_size = array_bit_size;
                    }
                }
                break;
            default:
                assert(0);
                exit(1);
        }
    }

    return 0;
}